

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

void ssh2_ppk_derive_keys
               (uint fmt_version,ppk_cipher *ciphertype,ptrlen passphrase,strbuf *storage,
               ptrlen *cipherkey,ptrlen *cipheriv,ptrlen *mackey,ptrlen passphrase_salt,
               ppk_save_parameters *params)

{
  ssh_hashalg *psVar1;
  uchar *puVar2;
  ssh_hash *h;
  size_t len;
  undefined4 in_register_0000003c;
  uint32_t taglen;
  ulong uVar3;
  uint ctr;
  unsigned_long val;
  ptrlen pVar4;
  ptrlen passphrase_local;
  uint32_t passes;
  BinarySource src [1];
  
  psVar1 = (ssh_hashalg *)CONCAT44(in_register_0000003c,fmt_version);
  if (fmt_version - 1 < 2) {
    uVar3 = 0;
    val = 0;
    while( true ) {
      if (ciphertype->keylen <= uVar3) break;
      psVar1 = (ssh_hashalg *)ssh_hash_new(psVar1);
      BinarySink_put_uint32((BinarySink *)psVar1->reset,val);
      BinarySink_put_datapl((BinarySink *)psVar1->reset,passphrase);
      puVar2 = (uchar *)strbuf_append(storage,0x14);
      ssh_hash_final((ssh_hash *)psVar1,puVar2);
      val = (unsigned_long)((int)val + 1);
      uVar3 = (ulong)((int)uVar3 + 0x14);
    }
    strbuf_shrink_to(storage,ciphertype->keylen);
    psVar1 = (ssh_hashalg *)storage->binarysink_;
    BinarySink_put_padding((BinarySink *)psVar1,ciphertype->ivlen,'\0');
    h = ssh_hash_new(psVar1);
    len = h->vt->hlen;
    pVar4.len = 0x1e;
    pVar4.ptr = "putty-private-key-file-mac-key";
    BinarySink_put_datapl(h->binarysink_,pVar4);
    BinarySink_put_datapl(h->binarysink_,passphrase);
    puVar2 = (uchar *)strbuf_append(storage,len);
    ssh_hash_final(h,puVar2);
  }
  else {
    if (fmt_version != 3) {
      __assert_fail("false && \"bad format version in ssh2_ppk_derive_keys\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                    0x2a7,
                    "void ssh2_ppk_derive_keys(unsigned int, const struct ppk_cipher *, ptrlen, strbuf *, ptrlen *, ptrlen *, ptrlen *, ptrlen, ppk_save_parameters *)"
                   );
    }
    if (ciphertype->keylen == 0) {
      len = 0;
    }
    else {
      src[0].data = anon_var_dwarf_331ec + 10;
      src[0].pos = 0;
      taglen = (int)ciphertype->ivlen + (int)ciphertype->keylen + 0x20;
      if (params->argon2_passes_auto == true) {
        argon2_choose_passes
                  (params->argon2_flavour,params->argon2_mem,(params->field_4).argon2_passes,&passes
                   ,params->argon2_parallelism,taglen,passphrase,passphrase_salt,
                   (ptrlen)ZEXT816(0x16ff31),(ptrlen)ZEXT816(0x16ff31),storage);
        params->argon2_passes_auto = false;
        (params->field_4).argon2_passes = passes;
      }
      else {
        argon2(params->argon2_flavour,params->argon2_mem,(params->field_4).argon2_passes,
               params->argon2_parallelism,taglen,passphrase,passphrase_salt,
               (ptrlen)ZEXT816(0x16ff31),(ptrlen)ZEXT816(0x16ff31),storage);
      }
      len = 0x20;
    }
  }
  src[0].data = storage->u;
  src[0].len = storage->len;
  src[0].binarysource_ = src;
  src[0].pos = 0;
  src[0].err = BSE_NO_ERROR;
  pVar4 = BinarySource_get_data(src[0].binarysource_,ciphertype->keylen);
  *cipherkey = pVar4;
  pVar4 = BinarySource_get_data(src[0].binarysource_,ciphertype->ivlen);
  *cipheriv = pVar4;
  pVar4 = BinarySource_get_data(src[0].binarysource_,len);
  *mackey = pVar4;
  return;
}

Assistant:

static void ssh2_ppk_derive_keys(
    unsigned fmt_version, const struct ppk_cipher *ciphertype,
    ptrlen passphrase, strbuf *storage, ptrlen *cipherkey, ptrlen *cipheriv,
    ptrlen *mackey, ptrlen passphrase_salt, ppk_save_parameters *params)
{
    size_t mac_keylen;

    switch (fmt_version) {
      case 3: {
        if (ciphertype->keylen == 0) {
            mac_keylen = 0;
            break;
        }
        ptrlen empty = PTRLEN_LITERAL("");

        mac_keylen = 32;

        uint32_t taglen = ciphertype->keylen + ciphertype->ivlen + mac_keylen;

        if (params->argon2_passes_auto) {
            uint32_t passes;

            argon2_choose_passes(
                params->argon2_flavour, params->argon2_mem,
                params->argon2_milliseconds, &passes,
                params->argon2_parallelism, taglen,
                passphrase, passphrase_salt, empty, empty, storage);

            params->argon2_passes_auto = false;
            params->argon2_passes = passes;
        } else {
            argon2(params->argon2_flavour, params->argon2_mem,
                   params->argon2_passes, params->argon2_parallelism, taglen,
                   passphrase, passphrase_salt, empty, empty, storage);
        }

        break;
      }

      case 2:
      case 1: {
        /* Counter-mode iteration to generate cipher key data. */
        for (unsigned ctr = 0; ctr * 20 < ciphertype->keylen; ctr++) {
            ssh_hash *h = ssh_hash_new(&ssh_sha1);
            put_uint32(h, ctr);
            put_datapl(h, passphrase);
            ssh_hash_final(h, strbuf_append(storage, 20));
        }
        strbuf_shrink_to(storage, ciphertype->keylen);

        /* In this version of the format, the CBC IV was always all 0. */
        put_padding(storage, ciphertype->ivlen, 0);

        /* Completely separate hash for the MAC key. */
        ssh_hash *h = ssh_hash_new(&ssh_sha1);
        mac_keylen = ssh_hash_alg(h)->hlen;
        put_datapl(h, PTRLEN_LITERAL("putty-private-key-file-mac-key"));
        put_datapl(h, passphrase);
        ssh_hash_final(h, strbuf_append(storage, mac_keylen));

        break;
      }

      default:
        unreachable("bad format version in ssh2_ppk_derive_keys");
    }

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(storage));
    *cipherkey = get_data(src, ciphertype->keylen);
    *cipheriv = get_data(src, ciphertype->ivlen);
    *mackey = get_data(src, mac_keylen);
}